

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_buffer_block(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  size_type sVar2;
  bool local_2d;
  uint32_t local_2c;
  uint32_t local_28;
  bool local_21;
  SPIRType *pSStack_20;
  bool ubo_block;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSStack_20 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  local_2d = false;
  if (type->basetype == Boolean) {
    local_28 = (pSStack_20->super_IVariant).self.id;
    local_2d = Compiler::has_decoration(&this->super_Compiler,(ID)local_28,Block);
  }
  local_21 = local_2d;
  local_2c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  sVar2 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->flattened_buffer_blocks,&local_2c);
  if (sVar2 == 0) {
    bVar1 = is_legacy(this);
    if (((bVar1) || ((((this->options).es & 1U) == 0 && ((this->options).version == 0x82)))) ||
       (((local_21 & 1U) != 0 && (((this->options).emit_uniform_buffer_as_plain_uniforms & 1U) != 0)
        ))) {
      emit_buffer_block_legacy(this,(SPIRVariable *)type);
    }
    else {
      emit_buffer_block_native(this,(SPIRVariable *)type);
    }
  }
  else {
    emit_buffer_block_flattened(this,(SPIRVariable *)type);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	bool ubo_block = var.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock);

	if (flattened_buffer_blocks.count(var.self))
		emit_buffer_block_flattened(var);
	else if (is_legacy() || (!options.es && options.version == 130) ||
	         (ubo_block && options.emit_uniform_buffer_as_plain_uniforms))
		emit_buffer_block_legacy(var);
	else
		emit_buffer_block_native(var);
}